

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.h
# Opt level: O0

Fad<float> * __thiscall
TPZMatrix<Fad<float>_>::operator()(TPZMatrix<Fad<float>_> *this,int64_t row,int64_t col)

{
  int64_t iVar1;
  long in_RCX;
  long in_RDX;
  TPZBaseMatrix *in_RSI;
  Fad<float> *in_RDI;
  char *in_stack_000001b8;
  char *in_stack_000001c0;
  size_t in_stack_000003d8;
  char *in_stack_000003e0;
  
  iVar1 = TPZBaseMatrix::Rows(in_RSI);
  if (in_RDX < iVar1) {
    iVar1 = TPZBaseMatrix::Cols(in_RSI);
    if (((in_RCX < iVar1) && (-1 < in_RDX)) && (-1 < in_RCX)) goto LAB_0131bfbe;
  }
  Error(in_stack_000001c0,in_stack_000001b8);
  pzinternal::DebugStopImpl(in_stack_000003e0,in_stack_000003d8);
LAB_0131bfbe:
  (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,in_RSI,in_RDX,in_RCX);
  return in_RDI;
}

Assistant:

inline TVar TPZMatrix<TVar>::operator()(const int64_t row, const int64_t col) const{
	// bound checking
#ifndef PZNODEBUG
	if ( (row >= Rows()) || (col >= Cols()) || row <0 || col<0 ) {
		Error("TPZMatrix<TVar>::Operator()","Index out of range");
        DebugStop();
	}
#endif
	return GetVal(row,col);
}